

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5HashWrite
              (Fts5Hash *pHash,i64 iRowid,int iCol,int iPos,char bByte,char *pToken,int nToken)

{
  long lVar1;
  int iVar2;
  Fts5HashEntry **ppFVar3;
  Fts5HashEntry *pFVar4;
  sqlite3_uint64 n;
  uint uVar5;
  int iVar6;
  int iVar7;
  size_t __n;
  Fts5HashEntry *pFVar8;
  Fts5HashEntry **__s;
  ulong uVar9;
  size_t sVar10;
  Fts5HashEntry *pFVar11;
  ulong uVar12;
  Fts5HashEntry *p;
  Fts5HashEntry *pFVar13;
  long lVar14;
  bool bVar15;
  int local_74;
  ulong local_70;
  
  bVar15 = pHash->eDetail == 0;
  iVar7 = pHash->nSlot;
  uVar5 = fts5HashKey2(iVar7,bByte,(u8 *)pToken,nToken);
  ppFVar3 = pHash->aSlot;
  pFVar11 = (Fts5HashEntry *)(ppFVar3 + uVar5);
  __n = (size_t)nToken;
LAB_0019771a:
  pFVar11 = pFVar11->pHashNext;
  if (pFVar11 != (Fts5HashEntry *)0x0) goto code_r0x00197727;
  lVar1 = __n + 1;
  lVar14 = 0xf;
  if (0xf < lVar1) {
    lVar14 = lVar1;
  }
  if (iVar7 <= pHash->nEntry * 2) {
    __s = (Fts5HashEntry **)sqlite3_malloc64((long)iVar7 << 4);
    if (__s == (Fts5HashEntry **)0x0) {
      return 7;
    }
    iVar6 = iVar7 * 2;
    uVar12 = 0;
    memset(__s,0,(long)iVar7 << 4);
    uVar9 = (ulong)(uint)pHash->nSlot;
    if (pHash->nSlot < 1) {
      uVar9 = uVar12;
    }
    for (; uVar12 != uVar9; uVar12 = uVar12 + 1) {
      while (pFVar11 = ppFVar3[uVar12], pFVar11 != (Fts5HashEntry *)0x0) {
        ppFVar3[uVar12] = pFVar11->pHashNext;
        sVar10 = strlen((char *)(pFVar11 + 1));
        uVar5 = fts5HashKey(iVar6,(u8 *)(pFVar11 + 1),(int)sVar10);
        pFVar11->pHashNext = __s[uVar5];
        __s[uVar5] = pFVar11;
      }
    }
    sqlite3_free(ppFVar3);
    pHash->nSlot = iVar6;
    pHash->aSlot = __s;
    uVar5 = fts5HashKey2(iVar6,bByte,(u8 *)pToken,nToken);
  }
  local_70 = (ulong)uVar5;
  pFVar11 = (Fts5HashEntry *)sqlite3_malloc64(lVar14 + 0x71U);
  if (pFVar11 == (Fts5HashEntry *)0x0) {
    return 7;
  }
  pFVar11->nAlloc = 0;
  pFVar11->iSzPoslist = 0;
  pFVar11->nData = 0;
  pFVar11->nKey = 0;
  pFVar11->bDel = '\0';
  pFVar11->bContent = '\0';
  pFVar11->iCol = 0;
  pFVar11->iPos = 0;
  pFVar11->iRowid = 0;
  pFVar11->pHashNext = (Fts5HashEntry *)0x0;
  pFVar11->pScanNext = (Fts5HashEntry *)0x0;
  pFVar11->nAlloc = (int)(lVar14 + 0x71U);
  *(char *)&pFVar11[1].pHashNext = bByte;
  memcpy((void *)((long)&pFVar11[1].pHashNext + 1),pToken,__n);
  pFVar11->nKey = nToken;
  *(undefined1 *)((long)&pFVar11[1].pHashNext + lVar1) = 0;
  pFVar11->nData = nToken + 0x32;
  ppFVar3 = pHash->aSlot;
  pFVar11->pHashNext = ppFVar3[local_70];
  ppFVar3[local_70] = pFVar11;
  pHash->nEntry = pHash->nEntry + 1;
  iVar7 = sqlite3Fts5PutVarint((uchar *)((long)&pFVar11->pHashNext + (long)(nToken + 0x32)),iRowid);
  iVar7 = iVar7 + pFVar11->nData;
  pFVar11->nData = iVar7;
  pFVar11->iRowid = iRowid;
  pFVar11->iSzPoslist = iVar7;
  iVar2 = pHash->eDetail;
  iVar6 = iVar7;
  if (iVar2 != 1) {
    iVar7 = iVar7 + 1;
    pFVar11->nData = iVar7;
    pFVar11->iCol = -(ushort)(iVar2 != 0);
    iVar6 = iVar7;
  }
  goto LAB_00197967;
code_r0x00197727:
  if (((*(char *)&pFVar11[1].pHashNext != bByte) || (pFVar11->nKey != nToken)) ||
     (iVar6 = bcmp((void *)((long)&pFVar11[1].pHashNext + 1),pToken,__n), iVar6 != 0))
  goto LAB_0019771a;
  iVar7 = pFVar11->nData;
  if (pFVar11->nAlloc - iVar7 < 0x16) {
    n = (long)pFVar11->nAlloc * 2;
    pFVar8 = (Fts5HashEntry *)sqlite3_realloc64(pFVar11,n);
    if (pFVar8 == (Fts5HashEntry *)0x0) {
      return 7;
    }
    pFVar8->nAlloc = (int)n;
    pFVar4 = (Fts5HashEntry *)(pHash->aSlot + uVar5);
    do {
      pFVar13 = pFVar4;
      pFVar4 = pFVar13->pHashNext;
    } while (pFVar4 != pFVar11);
    pFVar13->pHashNext = pFVar8;
    iVar7 = pFVar8->nData;
    pFVar11 = pFVar8;
  }
  iVar6 = -iVar7;
  if (pFVar11->iRowid != iRowid) {
    fts5HashAddPoslistSize(pHash,pFVar11,(Fts5HashEntry *)0x0);
    iVar7 = sqlite3Fts5PutVarint
                      ((uchar *)((long)&pFVar11->pHashNext + (long)pFVar11->nData),
                       iRowid - pFVar11->iRowid);
    iVar7 = iVar7 + pFVar11->nData;
    pFVar11->nData = iVar7;
    pFVar11->iRowid = iRowid;
    pFVar11->iSzPoslist = iVar7;
    iVar2 = pHash->eDetail;
    bVar15 = true;
    if (iVar2 != 1) {
      iVar7 = iVar7 + 1;
      pFVar11->nData = iVar7;
      pFVar11->iCol = -(ushort)(iVar2 != 0);
      pFVar11->iPos = 0;
    }
  }
LAB_00197967:
  if (iCol < 0) {
    pFVar11->bDel = '\x01';
    goto LAB_00197a87;
  }
  if (pHash->eDetail == 1) {
    pFVar11->bContent = '\x01';
    goto LAB_00197a87;
  }
  if (pFVar11->iCol == iCol) {
LAB_00197a5a:
    local_74 = iPos;
    if (!bVar15) goto LAB_00197a87;
  }
  else {
    if (pHash->eDetail == 0) {
      pFVar11->nData = iVar7 + 1;
      *(undefined1 *)((long)&pFVar11->pHashNext + (long)iVar7) = 1;
      iVar7 = sqlite3Fts5PutVarint
                        ((uchar *)((long)&pFVar11->pHashNext + (long)pFVar11->nData),
                         (ulong)(uint)iCol);
      iVar7 = iVar7 + pFVar11->nData;
      pFVar11->nData = iVar7;
      pFVar11->iCol = (i16)iCol;
      pFVar11->iPos = 0;
      goto LAB_00197a5a;
    }
    pFVar11->iCol = (i16)iCol;
    local_74 = iCol;
  }
  iVar7 = sqlite3Fts5PutVarint
                    ((uchar *)((long)&pFVar11->pHashNext + (long)iVar7),
                     (long)((local_74 - pFVar11->iPos) + 2));
  iVar7 = iVar7 + pFVar11->nData;
  pFVar11->nData = iVar7;
  pFVar11->iPos = local_74;
LAB_00197a87:
  *pHash->pnByte = *pHash->pnByte + iVar7 + iVar6;
  return 0;
}

Assistant:

static int sqlite3Fts5HashWrite(
  Fts5Hash *pHash,
  i64 iRowid,                     /* Rowid for this entry */
  int iCol,                       /* Column token appears in (-ve -> delete) */
  int iPos,                       /* Position of token within column */
  char bByte,                     /* First byte of token */
  const char *pToken, int nToken  /* Token to add or remove to or from index */
){
  unsigned int iHash;
  Fts5HashEntry *p;
  u8 *pPtr;
  int nIncr = 0;                  /* Amount to increment (*pHash->pnByte) by */
  int bNew;                       /* If non-delete entry should be written */
  
  bNew = (pHash->eDetail==FTS5_DETAIL_FULL);

  /* Attempt to locate an existing hash entry */
  iHash = fts5HashKey2(pHash->nSlot, (u8)bByte, (const u8*)pToken, nToken);
  for(p=pHash->aSlot[iHash]; p; p=p->pHashNext){
    char *zKey = fts5EntryKey(p);
    if( zKey[0]==bByte 
     && p->nKey==nToken
     && memcmp(&zKey[1], pToken, nToken)==0 
    ){
      break;
    }
  }

  /* If an existing hash entry cannot be found, create a new one. */
  if( p==0 ){
    /* Figure out how much space to allocate */
    char *zKey;
    sqlite3_int64 nByte = sizeof(Fts5HashEntry) + (nToken+1) + 1 + 64;
    if( nByte<128 ) nByte = 128;

    /* Grow the Fts5Hash.aSlot[] array if necessary. */
    if( (pHash->nEntry*2)>=pHash->nSlot ){
      int rc = fts5HashResize(pHash);
      if( rc!=SQLITE_OK ) return rc;
      iHash = fts5HashKey2(pHash->nSlot, (u8)bByte, (const u8*)pToken, nToken);
    }

    /* Allocate new Fts5HashEntry and add it to the hash table. */
    p = (Fts5HashEntry*)sqlite3_malloc64(nByte);
    if( !p ) return SQLITE_NOMEM;
    memset(p, 0, sizeof(Fts5HashEntry));
    p->nAlloc = (int)nByte;
    zKey = fts5EntryKey(p);
    zKey[0] = bByte;
    memcpy(&zKey[1], pToken, nToken);
    assert( iHash==fts5HashKey(pHash->nSlot, (u8*)zKey, nToken+1) );
    p->nKey = nToken;
    zKey[nToken+1] = '\0';
    p->nData = nToken+1 + 1 + sizeof(Fts5HashEntry);
    p->pHashNext = pHash->aSlot[iHash];
    pHash->aSlot[iHash] = p;
    pHash->nEntry++;

    /* Add the first rowid field to the hash-entry */
    p->nData += sqlite3Fts5PutVarint(&((u8*)p)[p->nData], iRowid);
    p->iRowid = iRowid;

    p->iSzPoslist = p->nData;
    if( pHash->eDetail!=FTS5_DETAIL_NONE ){
      p->nData += 1;
      p->iCol = (pHash->eDetail==FTS5_DETAIL_FULL ? 0 : -1);
    }

    nIncr += p->nData;
  }else{

    /* Appending to an existing hash-entry. Check that there is enough 
    ** space to append the largest possible new entry. Worst case scenario 
    ** is:
    **
    **     + 9 bytes for a new rowid,
    **     + 4 byte reserved for the "poslist size" varint.
    **     + 1 byte for a "new column" byte,
    **     + 3 bytes for a new column number (16-bit max) as a varint,
    **     + 5 bytes for the new position offset (32-bit max).
    */
    if( (p->nAlloc - p->nData) < (9 + 4 + 1 + 3 + 5) ){
      sqlite3_int64 nNew = p->nAlloc * 2;
      Fts5HashEntry *pNew;
      Fts5HashEntry **pp;
      pNew = (Fts5HashEntry*)sqlite3_realloc64(p, nNew);
      if( pNew==0 ) return SQLITE_NOMEM;
      pNew->nAlloc = (int)nNew;
      for(pp=&pHash->aSlot[iHash]; *pp!=p; pp=&(*pp)->pHashNext);
      *pp = pNew;
      p = pNew;
    }
    nIncr -= p->nData;
  }
  assert( (p->nAlloc - p->nData) >= (9 + 4 + 1 + 3 + 5) );

  pPtr = (u8*)p;

  /* If this is a new rowid, append the 4-byte size field for the previous
  ** entry, and the new rowid for this entry.  */
  if( iRowid!=p->iRowid ){
    fts5HashAddPoslistSize(pHash, p, 0);
    p->nData += sqlite3Fts5PutVarint(&pPtr[p->nData], iRowid - p->iRowid);
    p->iRowid = iRowid;
    bNew = 1;
    p->iSzPoslist = p->nData;
    if( pHash->eDetail!=FTS5_DETAIL_NONE ){
      p->nData += 1;
      p->iCol = (pHash->eDetail==FTS5_DETAIL_FULL ? 0 : -1);
      p->iPos = 0;
    }
  }

  if( iCol>=0 ){
    if( pHash->eDetail==FTS5_DETAIL_NONE ){
      p->bContent = 1;
    }else{
      /* Append a new column value, if necessary */
      assert( iCol>=p->iCol );
      if( iCol!=p->iCol ){
        if( pHash->eDetail==FTS5_DETAIL_FULL ){
          pPtr[p->nData++] = 0x01;
          p->nData += sqlite3Fts5PutVarint(&pPtr[p->nData], iCol);
          p->iCol = (i16)iCol;
          p->iPos = 0;
        }else{
          bNew = 1;
          p->iCol = (i16)(iPos = iCol);
        }
      }

      /* Append the new position offset, if necessary */
      if( bNew ){
        p->nData += sqlite3Fts5PutVarint(&pPtr[p->nData], iPos - p->iPos + 2);
        p->iPos = iPos;
      }
    }
  }else{
    /* This is a delete. Set the delete flag. */
    p->bDel = 1;
  }

  nIncr += p->nData;
  *pHash->pnByte += nIncr;
  return SQLITE_OK;
}